

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_547509::BackendCollection::tryPopulateCollection(BackendCollection *this)

{
  QBasicAtomicInteger<signed_char> QVar1;
  Type *pTVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  QVar1._q_value.super___atomic_base<signed_char>._M_i =
       QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>::guard._q_value.
       super___atomic_base<signed_char>._M_i;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>::guard.
                 _q_value.super___atomic_base<signed_char>._M_i) {
    QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>::
    instance();
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._0_8_ = &tryPopulateCollection::mutex;
    QBasicMutex::lock(&tryPopulateCollection::mutex);
    local_28[8] = true;
    if ((this->backends).super__Vector_base<QTlsBackend_*,_std::allocator<QTlsBackend_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->backends).super__Vector_base<QTlsBackend_*,_std::allocator<QTlsBackend_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>::
      instance();
      QFactoryLoader::update();
      do {
        pTVar2 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>
                 ::instance();
        lVar3 = QFactoryLoader::instance((int)pTVar2);
      } while (lVar3 != 0);
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return -2 < (char)QVar1._q_value.super___atomic_base<signed_char>._M_i;
  }
  __stack_chk_fail();
}

Assistant:

bool tryPopulateCollection()
    {
        if (!qtlsbLoader())
            return false;

        Q_CONSTINIT static QBasicMutex mutex;
        const QMutexLocker locker(&mutex);
        if (backends.size())
            return true;

#if QT_CONFIG(library)
        qtlsbLoader->update();
#endif
        int index = 0;
        while (qtlsbLoader->instance(index))
            ++index;

        return true;
    }